

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btCompoundLeafCallback::ProcessChildShape
          (btCompoundLeafCallback *this,btCollisionShape *childShape,int index)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  btTransform *pbVar15;
  void *pvVar16;
  btCollisionShape *pbVar17;
  btManifoldResult *pbVar18;
  byte bVar19;
  byte bVar20;
  bool bVar21;
  int iVar22;
  undefined4 extraout_var;
  btCollisionObject *pbVar23;
  long lVar24;
  btCollisionObjectWrapper *pbVar25;
  long lVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  btVector3 aabbMax1;
  btVector3 aabbMin1;
  btVector3 aabbMax0;
  btVector3 aabbMin0;
  btCollisionObjectWrapper compoundWrap;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b0;
  float local_ac;
  float local_a8;
  btCollisionObjectWrapper *local_a0;
  btCollisionShape *local_98;
  btCollisionObject *local_90;
  undefined8 *local_88;
  undefined4 local_80;
  int local_7c;
  undefined1 local_78 [16];
  undefined8 local_60;
  float local_58;
  undefined4 local_54;
  undefined8 local_50;
  float local_48;
  undefined4 local_44;
  undefined8 local_40;
  float local_38;
  undefined4 local_34;
  undefined1 local_30 [16];
  
  pbVar15 = this->m_compoundColObjWrap->m_worldTransform;
  fVar1 = (pbVar15->m_basis).m_el[0].m_floats[0];
  fVar2 = (pbVar15->m_basis).m_el[0].m_floats[1];
  fVar3 = (pbVar15->m_basis).m_el[0].m_floats[2];
  fVar4 = (pbVar15->m_basis).m_el[1].m_floats[0];
  fVar5 = (pbVar15->m_basis).m_el[1].m_floats[1];
  fVar6 = (pbVar15->m_basis).m_el[1].m_floats[2];
  fVar7 = (pbVar15->m_basis).m_el[2].m_floats[0];
  fVar8 = (pbVar15->m_basis).m_el[2].m_floats[1];
  local_78 = ZEXT416((uint)fVar8);
  fVar9 = (pbVar15->m_basis).m_el[2].m_floats[2];
  pvVar16 = this->m_compoundColObjWrap->m_shape[1].m_userPointer;
  lVar26 = (long)index;
  lVar24 = lVar26 * 0x58;
  fVar10 = *(float *)((long)pvVar16 + lVar24 + 8);
  fVar11 = *(float *)((long)pvVar16 + lVar24 + 0x18);
  fVar12 = *(float *)((long)pvVar16 + lVar24 + 0x28);
  local_58 = fVar12 * fVar3 + fVar10 * fVar1 + fVar2 * fVar11;
  local_48 = fVar12 * fVar6 + fVar10 * fVar4 + fVar5 * fVar11;
  local_38 = fVar12 * fVar9 + fVar10 * fVar7 + fVar11 * fVar8;
  fVar10 = *(float *)((long)pvVar16 + lVar24 + 0x30);
  fVar11 = *(float *)((long)pvVar16 + lVar24 + 0x34);
  fVar12 = *(float *)((long)pvVar16 + lVar24 + 0x38);
  uVar13 = *(undefined8 *)(pbVar15->m_origin).m_floats;
  uVar14 = *(undefined8 *)((long)pvVar16 + lVar24 + 0x10);
  fVar31 = (float)uVar14;
  fVar32 = (float)((ulong)uVar14 >> 0x20);
  fVar29 = (float)*(undefined8 *)((long)pvVar16 + lVar24);
  fVar30 = (float)((ulong)*(undefined8 *)((long)pvVar16 + lVar24) >> 0x20);
  uVar14 = *(undefined8 *)((long)pvVar16 + lVar24 + 0x20);
  fVar27 = (float)uVar14;
  fVar28 = (float)((ulong)uVar14 >> 0x20);
  local_60 = CONCAT44(fVar3 * fVar28 + fVar1 * fVar30 + fVar2 * fVar32,
                      fVar3 * fVar27 + fVar1 * fVar29 + fVar2 * fVar31);
  local_54 = 0;
  local_50 = CONCAT44(fVar6 * fVar28 + fVar4 * fVar30 + fVar5 * fVar32,
                      fVar6 * fVar27 + fVar4 * fVar29 + fVar5 * fVar31);
  local_44 = 0;
  local_40 = CONCAT44(fVar9 * fVar28 + fVar7 * fVar30 + fVar8 * fVar32,
                      fVar9 * fVar27 + fVar7 * fVar29 + fVar8 * fVar31);
  local_34 = 0;
  local_30._4_4_ = fVar6 * fVar12 + fVar4 * fVar10 + fVar11 * fVar5 + (float)((ulong)uVar13 >> 0x20)
  ;
  local_30._0_4_ = fVar3 * fVar12 + fVar1 * fVar10 + fVar11 * fVar2 + (float)uVar13;
  local_30._8_4_ =
       fVar12 * fVar9 + fVar10 * fVar7 + fVar8 * fVar11 + (pbVar15->m_origin).m_floats[2];
  local_30._12_4_ = 0;
  (*childShape->_vptr_btCollisionShape[2])(childShape,&local_60,&local_b0,&local_c0);
  pbVar17 = this->m_otherObjWrap->m_shape;
  (*pbVar17->_vptr_btCollisionShape[2])
            (pbVar17,this->m_otherObjWrap->m_worldTransform,&local_d0,&local_e0);
  if ((gCompoundChildShapePairCallback != (btShapePairCallback)0x0) &&
     (bVar21 = (*gCompoundChildShapePairCallback)(this->m_otherObjWrap->m_shape,childShape), !bVar21
     )) {
    return;
  }
  bVar20 = 1;
  if ((local_b0 <= local_e0) && (bVar20 = 1, local_d0 <= local_c0)) {
    bVar20 = 0;
  }
  bVar19 = 1;
  if ((local_a8 <= local_d8) && (local_c8 <= local_b8)) {
    bVar19 = bVar20;
  }
  if ((local_ac <= local_dc) && (!(bool)(bVar19 | local_bc < local_cc))) {
    local_a0 = this->m_compoundColObjWrap;
    pbVar23 = local_a0->m_collisionObject;
    local_80 = 0xffffffff;
    local_98 = childShape;
    local_90 = pbVar23;
    local_88 = &local_60;
    local_7c = index;
    if (this->m_childCollisionAlgorithms[lVar26] == (btCollisionAlgorithm *)0x0) {
      iVar22 = (*this->m_dispatcher->_vptr_btDispatcher[2])
                         (this->m_dispatcher,&local_a0,this->m_otherObjWrap,this->m_sharedManifold);
      this->m_childCollisionAlgorithms[lVar26] =
           (btCollisionAlgorithm *)CONCAT44(extraout_var,iVar22);
      pbVar23 = this->m_compoundColObjWrap->m_collisionObject;
    }
    pbVar18 = this->m_resultOut;
    pbVar25 = pbVar18->m_body0Wrap;
    if (pbVar25->m_collisionObject == pbVar23) {
      lVar24 = 0x10;
    }
    else {
      pbVar25 = pbVar18->m_body1Wrap;
      lVar24 = 0x18;
    }
    *(btCollisionObjectWrapper ***)((long)&(pbVar18->super_Result)._vptr_Result + lVar24) =
         &local_a0;
    (**(code **)((long)(pbVar18->super_Result)._vptr_Result + lVar24))(pbVar18,0xffffffff,index);
    (*this->m_childCollisionAlgorithms[lVar26]->_vptr_btCollisionAlgorithm[2])
              (this->m_childCollisionAlgorithms[lVar26],&local_a0,this->m_otherObjWrap,
               this->m_dispatchInfo,this->m_resultOut);
    (&this->m_resultOut->m_body0Wrap)
    [this->m_resultOut->m_body0Wrap->m_collisionObject !=
     this->m_compoundColObjWrap->m_collisionObject] = pbVar25;
  }
  return;
}

Assistant:

void	ProcessChildShape(const btCollisionShape* childShape,int index)
	{
		btAssert(index>=0);
		const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(m_compoundColObjWrap->getCollisionShape());
		btAssert(index<compoundShape->getNumChildShapes());


		//backup
		btTransform	orgTrans = m_compoundColObjWrap->getWorldTransform();
		
		const btTransform& childTrans = compoundShape->getChildTransform(index);
		btTransform	newChildWorldTrans = orgTrans*childTrans ;

		//perform an AABB check first
		btVector3 aabbMin0,aabbMax0,aabbMin1,aabbMax1;
		childShape->getAabb(newChildWorldTrans,aabbMin0,aabbMax0);
		m_otherObjWrap->getCollisionShape()->getAabb(m_otherObjWrap->getWorldTransform(),aabbMin1,aabbMax1);

		if (gCompoundChildShapePairCallback)
		{
			if (!gCompoundChildShapePairCallback(m_otherObjWrap->getCollisionShape(), childShape))
				return;
		}

		if (TestAabbAgainstAabb2(aabbMin0,aabbMax0,aabbMin1,aabbMax1))
		{

			btCollisionObjectWrapper compoundWrap(this->m_compoundColObjWrap,childShape,m_compoundColObjWrap->getCollisionObject(),newChildWorldTrans,-1,index);


			//the contactpoint is still projected back using the original inverted worldtrans
			if (!m_childCollisionAlgorithms[index])
				m_childCollisionAlgorithms[index] = m_dispatcher->findAlgorithm(&compoundWrap,m_otherObjWrap,m_sharedManifold);

			
			const btCollisionObjectWrapper* tmpWrap = 0;

			///detect swapping case
			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				tmpWrap = m_resultOut->getBody0Wrap();
				m_resultOut->setBody0Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersA(-1,index);
			} else
			{
				tmpWrap = m_resultOut->getBody1Wrap();
				m_resultOut->setBody1Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersB(-1,index);
			}


			m_childCollisionAlgorithms[index]->processCollision(&compoundWrap,m_otherObjWrap,m_dispatchInfo,m_resultOut);

#if 0
			if (m_dispatchInfo.m_debugDraw && (m_dispatchInfo.m_debugDraw->getDebugMode() & btIDebugDraw::DBG_DrawAabb))
			{
				btVector3 worldAabbMin,worldAabbMax;
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin0,aabbMax0,btVector3(1,1,1));
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin1,aabbMax1,btVector3(1,1,1));
			}
#endif

			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				m_resultOut->setBody0Wrap(tmpWrap);
			} else
			{
				m_resultOut->setBody1Wrap(tmpWrap);
			}
			
		}
	}